

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O0

void SortRootMove(int num_of_all_movements,Movement *all_movements)

{
  long in_RSI;
  int in_EDI;
  int i;
  _func_bool_Movement_ptr_Movement_ptr *unaff_retaddr;
  undefined4 in_stack_00000010;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
    if (*(uint *)(in_RSI + (long)local_14 * 0xc + 4) < 0x7fffffe8) {
      *(UINT32 *)(in_RSI + (long)local_14 * 0xc + 4) =
           HistoryTable[*(byte *)(in_RSI + (long)local_14 * 0xc)]
           [*(byte *)(in_RSI + (long)local_14 * 0xc + 1)];
    }
  }
  std::sort<Movement*,bool(*)(Movement&,Movement&)>
            ((Movement *)CONCAT44(num_of_all_movements,in_stack_00000010),all_movements,
             unaff_retaddr);
  return;
}

Assistant:

void SortRootMove(int num_of_all_movements, Movement* all_movements){
    // 对着法做历史表启发
    for(int i = 0; i < num_of_all_movements; i++){
        if(all_movements[i].value < MAX_MOVE_VALUE - 24){
            all_movements[i].value = HistoryTable[all_movements[i].from][all_movements[i].to];
        }
    }
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
}